

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O3

int is_whole_packet_present(stb_vorbis *f)

{
  byte bVar1;
  uint uVar2;
  bool bVar3;
  uint8 *puVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint8 *puVar8;
  STBVorbisError SVar9;
  uint8 *puVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  
  uVar6 = f->next_seg;
  uVar7 = (ulong)(int)uVar6;
  puVar4 = f->stream;
  bVar3 = uVar7 != 0xffffffffffffffff;
  if (uVar7 == 0xffffffffffffffff) {
    bVar13 = true;
  }
  else {
    uVar2 = f->segment_count;
    if ((int)uVar6 < (int)uVar2) {
      puVar10 = f->segments + uVar7;
      do {
        puVar4 = puVar4 + *puVar10;
        uVar6 = (uint)uVar7;
        if ((ulong)*puVar10 != 0xff) break;
        uVar5 = (uint)uVar7 + 1;
        uVar7 = (ulong)uVar5;
        puVar10 = puVar10 + 1;
        uVar6 = uVar2;
      } while (uVar2 != uVar5);
    }
    SVar9 = VORBIS_need_more_data;
    if (f->stream_end < puVar4) goto LAB_0017d057;
    bVar13 = uVar6 == 0xffffffff || uVar6 == uVar2;
  }
  while( true ) {
    if (!bVar13) {
      return 1;
    }
    puVar10 = f->stream_end;
    if (puVar10 <= puVar4 + 0x1a) break;
    SVar9 = VORBIS_invalid_stream;
    if ((*(uint8 (*) [4])puVar4 != ogg_page_header) || ((char)*(int *)(puVar4 + 4) != '\0'))
    goto LAB_0017d057;
    if (bVar3) {
      if ((puVar4[5] & 1) == 0) goto LAB_0017d057;
    }
    else if ((f->previous_length != 0) && ((puVar4[5] & 1) != 0)) goto LAB_0017d057;
    bVar1 = puVar4[0x1a];
    uVar7 = (ulong)bVar1;
    puVar8 = puVar4 + uVar7 + 0x1b;
    if (puVar10 < puVar8) break;
    if (bVar1 == 0) {
      uVar12 = 0;
    }
    else {
      uVar11 = 0;
      do {
        puVar8 = puVar8 + puVar4[uVar11 + 0x1b];
        uVar12 = uVar11;
        if ((ulong)puVar4[uVar11 + 0x1b] != 0xff) break;
        uVar11 = uVar11 + 1;
        uVar12 = uVar7;
      } while (uVar7 != uVar11);
    }
    puVar4 = puVar8;
    bVar13 = (uint)uVar12 == (uint)bVar1;
    bVar3 = true;
    SVar9 = VORBIS_need_more_data;
    if (puVar10 < puVar4) goto LAB_0017d057;
  }
  SVar9 = VORBIS_need_more_data;
LAB_0017d057:
  f->error = SVar9;
  return 0;
}

Assistant:

static int is_whole_packet_present(stb_vorbis *f)
{
   // make sure that we have the packet available before continuing...
   // this requires a full ogg parse, but we know we can fetch from f->stream

   // instead of coding this out explicitly, we could save the current read state,
   // read the next packet with get8() until end-of-packet, check f->eof, then
   // reset the state? but that would be slower, esp. since we'd have over 256 bytes
   // of state to restore (primarily the page segment table)

   int s = f->next_seg, first = TRUE;
   uint8 *p = f->stream;

   if (s != -1) { // if we're not starting the packet with a 'continue on next page' flag
      for (; s < f->segment_count; ++s) {
         p += f->segments[s];
         if (f->segments[s] < 255)               // stop at first short segment
            break;
      }
      // either this continues, or it ends it...
      if (s == f->segment_count)
         s = -1; // set 'crosses page' flag
      if (p > f->stream_end)                     return error(f, VORBIS_need_more_data);
      first = FALSE;
   }
   for (; s == -1;) {
      uint8 *q;
      int n;

      // check that we have the page header ready
      if (p + 26 >= f->stream_end)               return error(f, VORBIS_need_more_data);
      // validate the page
      if (memcmp(p, ogg_page_header, 4))         return error(f, VORBIS_invalid_stream);
      if (p[4] != 0)                             return error(f, VORBIS_invalid_stream);
      if (first) { // the first segment must NOT have 'continued_packet', later ones MUST
         if (f->previous_length)
            if ((p[5] & PAGEFLAG_continued_packet))  return error(f, VORBIS_invalid_stream);
         // if no previous length, we're resynching, so we can come in on a continued-packet,
         // which we'll just drop
      } else {
         if (!(p[5] & PAGEFLAG_continued_packet)) return error(f, VORBIS_invalid_stream);
      }
      n = p[26]; // segment counts
      q = p+27;  // q points to segment table
      p = q + n; // advance past header
      // make sure we've read the segment table
      if (p > f->stream_end)                     return error(f, VORBIS_need_more_data);
      for (s=0; s < n; ++s) {
         p += q[s];
         if (q[s] < 255)
            break;
      }
      if (s == n)
         s = -1; // set 'crosses page' flag
      if (p > f->stream_end)                     return error(f, VORBIS_need_more_data);
      first = FALSE;
   }
   return TRUE;
}